

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int get_attr_id(attr_list list,int item_no,atom_t *item)

{
  byte bVar1;
  int_attr_struct *piVar2;
  uint uVar3;
  atom_t aVar4;
  ulong uVar5;
  attr_p paVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  attr_list p_Var10;
  uint uVar11;
  
  uVar9 = (ulong)(uint)item_no;
  p_Var10 = list;
  if (global_as_lock != (atl_lock_func)0x0) {
    p_Var10 = (attr_list)global_as_lock_data;
    (*global_as_lock)(global_as_lock_data);
  }
  init_global_atom_server((atom_server *)p_Var10);
  if (global_as_unlock != (atl_lock_func)0x0) {
    (*global_as_unlock)(global_as_lock_data);
  }
  uVar3 = 0;
  if (list != (attr_list)0x0 && -1 < item_no) {
    if (list->list_of_lists == 0) {
      piVar2 = (list->l).list.iattrs;
      bVar1 = piVar2->int_attr_count;
      if ((uint)item_no < (uint)bVar1 + (uint)bVar1) {
        if ((uint)item_no < (uint)bVar1) {
          aVar4 = piVar2->iattr[uVar9].attr_id;
        }
        else {
          aVar4 = (list->l).list.attributes[(long)item_no - (ulong)bVar1].attr_id;
        }
        *item = aVar4;
        uVar3 = 1;
      }
    }
    else {
      uVar3 = (list->l).lists.sublist_count;
      uVar7 = 0;
      uVar5 = 0;
      if (0 < (int)uVar3) {
        uVar5 = (ulong)uVar3;
      }
      for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        p_Var10 = (list->l).lists.lists[uVar7];
        piVar2 = (p_Var10->l).list.iattrs;
        bVar1 = piVar2->int_attr_count;
        iVar8 = (int)uVar9;
        uVar11 = iVar8 - ((uint)bVar1 + (uint)bVar1);
        if (uVar11 == 0 || iVar8 < (int)((uint)bVar1 + (uint)bVar1)) {
          if (iVar8 < (int)(uint)bVar1) {
            paVar6 = (attr_p)(piVar2->iattr + iVar8);
          }
          else {
            paVar6 = (p_Var10->l).list.attributes + ((long)iVar8 - (ulong)bVar1);
          }
          *item = paVar6->attr_id;
          break;
        }
        uVar9 = (ulong)uVar11;
      }
      uVar3 = (uint)((long)uVar7 < (long)(int)uVar3);
    }
  }
  return uVar3;
}

Assistant:

extern int
get_attr_id(attr_list list, int item_no, atom_t *item)
{

    atl_lock();
    init_global_atom_server(&global_as);
    atl_unlock();

    if (item_no < 0) return 0;

    if (list == NULL) return 0;

    if (!list->list_of_lists) {
        int int_attr_count = list->l.list.iattrs->int_attr_count;
        int other_attr_count = list->l.list.iattrs->int_attr_count;
        int total_attr_count = int_attr_count + other_attr_count;

        if (item_no >= total_attr_count) return 0;

        if (item_no < int_attr_count) {
            *item = list->l.list.iattrs->iattr[item_no].attr_id;
	    return 1;
        } else {
            item_no -= int_attr_count;
            *item = list->l.list.attributes[item_no].attr_id;
	    return 1;
        }
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            attr_list atl = list->l.lists.lists[i];
            int int_attr_count = atl->l.list.iattrs->int_attr_count;
            int other_attr_count = atl->l.list.iattrs->int_attr_count;
            int total_attr_count = int_attr_count + other_attr_count;

            if (item_no > total_attr_count) {
                item_no -= total_attr_count;
	    } else {
                if (item_no < int_attr_count) {
                    *item = atl->l.list.iattrs->iattr[item_no].attr_id;
		    return 1;
                } else {
                    item_no -= int_attr_count;
                    *item = atl->l.list.attributes[item_no].attr_id;
		    return 1;
                }
            }
        }
    }
    return 0;
}